

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O3

void __thiscall
vkt::sparse::anon_unknown_0::IndexBufferTestInstance::rendererDraw
          (IndexBufferTestInstance *this,VkPipelineLayout pipelineLayout,VkCommandBuffer cmdBuffer)

{
  ostringstream *this_00;
  DeviceDriver *pDVar1;
  VkDeviceSize vertexOffset;
  undefined1 local_1a0 [384];
  
  local_1a0._0_8_ =
       ((this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
        super_SparseResourcesBaseInstance.super_TestInstance.m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "Drawing a grid of triangles from a sparse index buffer. There should be no red pixels visible."
             ,0x5e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  pDVar1 = (this->super_DrawGridTestInstance).super_SparseBufferTestInstance.
           super_SparseResourcesBaseInstance.m_deviceDriver.
           super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  local_1a0._0_8_ = (TestLog *)0x0;
  (*(pDVar1->super_DeviceInterface)._vptr_DeviceInterface[0x58])
            (pDVar1,cmdBuffer,0,1,&this->m_vertexBuffer,local_1a0);
  (*(pDVar1->super_DeviceInterface)._vptr_DeviceInterface[0x57])
            (pDVar1,cmdBuffer,
             (this->super_DrawGridTestInstance).m_sparseBuffer.
             super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0,1);
  (*(pDVar1->super_DeviceInterface)._vptr_DeviceInterface[0x5a])
            (pDVar1,cmdBuffer,(ulong)this->m_halfVertexCount,1,0,0,0);
  (*(pDVar1->super_DeviceInterface)._vptr_DeviceInterface[0x57])
            (pDVar1,cmdBuffer,
             (this->super_DrawGridTestInstance).m_sparseBuffer.
             super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (this->super_DrawGridTestInstance).m_perDrawBufferOffset <<
             ((this->super_DrawGridTestInstance).super_SparseBufferTestInstance.m_residency & 0x3fU)
             ,1);
  (*(pDVar1->super_DeviceInterface)._vptr_DeviceInterface[0x5a])
            (pDVar1,cmdBuffer,(ulong)this->m_halfVertexCount,1,0,0,0);
  return;
}

Assistant:

void rendererDraw (const VkPipelineLayout pipelineLayout, const VkCommandBuffer cmdBuffer) const
	{
		DE_UNREF(pipelineLayout);

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Drawing a grid of triangles from a sparse index buffer. There should be no red pixels visible." << tcu::TestLog::EndMessage;

		const DeviceInterface&	vk				= getDeviceInterface();
		const VkDeviceSize		vertexOffset	= 0ull;
		VkDeviceSize			indexOffset		= 0ull;

		vk.cmdBindVertexBuffers	(cmdBuffer, 0u, 1u, &m_vertexBuffer.get(), &vertexOffset);

		vk.cmdBindIndexBuffer	(cmdBuffer, *m_sparseBuffer, indexOffset, VK_INDEX_TYPE_UINT32);
		vk.cmdDrawIndexed		(cmdBuffer, m_halfVertexCount, 1u, 0u, 0, 0u);

		indexOffset += m_perDrawBufferOffset * (m_residency ? 2 : 1);

		vk.cmdBindIndexBuffer	(cmdBuffer, *m_sparseBuffer, indexOffset, VK_INDEX_TYPE_UINT32);
		vk.cmdDrawIndexed		(cmdBuffer, m_halfVertexCount, 1u, 0u, 0, 0u);
	}